

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

int aes_cbc_decrypt(aes_context *ctx,uint8_t *iv,uint8_t *input,size_t length,uint8_t *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  int iVar4;
  uchar temp [16];
  
  if ((length & 0xf) == 0) {
    iVar4 = 0;
    for (; length != 0; length = length - 0x10) {
      uVar1 = *(undefined8 *)input;
      uVar2 = *(undefined8 *)(input + 8);
      aes_ecb_decrypt(ctx,input,output);
      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
        output[lVar3] = output[lVar3] ^ iv[lVar3];
      }
      *(undefined8 *)iv = uVar1;
      *(undefined8 *)(iv + 8) = uVar2;
      input = input + 0x10;
      output = output + 0x10;
    }
  }
  else {
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int aes_cbc_decrypt(const aes_context* ctx, uint8_t iv[16], const uint8_t* input, size_t length, uint8_t* output) {
    int i;
    unsigned char temp[16];

    if (length % 16)
        return -1;
    while (length > 0) {
        memcpy(temp, input, 16);
        aes_ecb_decrypt(ctx, input, output);

        for (i = 0; i < 16; i++)
            output[i] = (unsigned char)(output[i] ^ iv[i]);

        memcpy(iv, temp, 16);

        input += 16;
        output += 16;
        length -= 16;
    }
    return 0;
}